

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O0

void greetable_proxy_set_property(GObject *object,guint prop_id,GValue *value,GParamSpec *pspec)

{
  GDBusPropertyInfo *pGVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  GVariant *variant;
  _ExtendedGDBusPropertyInfo *info;
  GParamSpec *pspec_local;
  GValue *value_local;
  guint prop_id_local;
  GObject *object_local;
  
  if ((prop_id == 0) || (prop_id != 1)) {
    g_assertion_message_expr
              (0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dpfrey[P]D-Bus_Example/build_O0/basics_gen.c"
               ,0x2ae,"greetable_proxy_set_property","prop_id != 0 && prop_id - 1 < 1");
  }
  pGVar1 = _greetable_property_info_pointers[prop_id - 1];
  uVar2 = g_variant_type_checked_(pGVar1->signature);
  uVar2 = g_dbus_gvalue_to_gvariant(value,uVar2);
  uVar3 = g_dbus_proxy_get_type();
  uVar3 = g_type_check_instance_cast(object,uVar3);
  uVar4 = g_variant_new("(ssv)","io.mangoh.Testing.Greetable",pGVar1->name,uVar2);
  g_dbus_proxy_call(uVar3,"org.freedesktop.DBus.Properties.Set",uVar4,0,0xffffffff,0,
                    greetable_proxy_set_property_cb,pGVar1);
  g_variant_unref(uVar2);
  return;
}

Assistant:

static void
greetable_proxy_set_property (GObject      *object,
  guint         prop_id,
  const GValue *value,
  GParamSpec   *pspec G_GNUC_UNUSED)
{
  const _ExtendedGDBusPropertyInfo *info;
  GVariant *variant;
  g_assert (prop_id != 0 && prop_id - 1 < 1);
  info = (const _ExtendedGDBusPropertyInfo *) _greetable_property_info_pointers[prop_id - 1];
  variant = g_dbus_gvalue_to_gvariant (value, G_VARIANT_TYPE (info->parent_struct.signature));
  g_dbus_proxy_call (G_DBUS_PROXY (object),
    "org.freedesktop.DBus.Properties.Set",
    g_variant_new ("(ssv)", "io.mangoh.Testing.Greetable", info->parent_struct.name, variant),
    G_DBUS_CALL_FLAGS_NONE,
    -1,
    NULL, (GAsyncReadyCallback) greetable_proxy_set_property_cb, (GDBusPropertyInfo *) &info->parent_struct);
  g_variant_unref (variant);
}